

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_log_test.cc
# Opt level: O3

Test * anon_unknown.dwarf_2f::BuildLogTestWriteRead::Create(void)

{
  StateTestWithBuiltinRules *this;
  
  this = (StateTestWithBuiltinRules *)operator_new(0x120);
  StateTestWithBuiltinRules::StateTestWithBuiltinRules(this);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__StateTestWithBuiltinRules_001f4030;
  this[1].super_Test._vptr_Test = (_func_int **)&PTR_IsPathDead_001f4070;
  g_current_test = (Test *)this;
  return &this->super_Test;
}

Assistant:

TEST_F(BuildLogTest, WriteRead) {
  AssertParse(&state_,
"build out: cat mid\n"
"build mid: cat in\n");

  BuildLog log1;
  string err;
  EXPECT_TRUE(log1.OpenForWrite(kTestFilename, *this, &err));
  ASSERT_EQ("", err);
  log1.RecordCommand(state_.edges_[0], 15, 18);
  log1.RecordCommand(state_.edges_[1], 20, 25);
  log1.Close();

  BuildLog log2;
  EXPECT_TRUE(log2.Load(kTestFilename, &err));
  ASSERT_EQ("", err);

  ASSERT_EQ(2u, log1.entries().size());
  ASSERT_EQ(2u, log2.entries().size());
  BuildLog::LogEntry* e1 = log1.LookupByOutput("out");
  ASSERT_TRUE(e1);
  BuildLog::LogEntry* e2 = log2.LookupByOutput("out");
  ASSERT_TRUE(e2);
  ASSERT_TRUE(*e1 == *e2);
  ASSERT_EQ(15, e1->start_time);
  ASSERT_EQ("out", e1->output);
}